

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

bool __thiscall opts::Options::parse(Options *this,int argc,char **argv)

{
  BasicOption *pBVar1;
  key_type *pkVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  pointer pBVar8;
  mapped_type *ppBVar9;
  mapped_type *ppBVar10;
  pointer ppVar11;
  pointer ppVar12;
  ostream *poVar13;
  key_type *in_RDX;
  uint in_ESI;
  long in_RDI;
  int j;
  char c;
  iterator opt_it_1;
  iterator opt_it;
  char *last;
  char *first;
  int i;
  anon_class_8_1_facd13c1 is_short;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *opt;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  long_opts;
  map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  short_opts;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  BasicOption *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  uint in_stack_fffffffffffffb2c;
  key_type *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  byte in_stack_fffffffffffffb47;
  undefined4 in_stack_fffffffffffffb50;
  uint in_stack_fffffffffffffb54;
  key_type *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  bool local_331;
  char local_308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator<char> local_2c1;
  string local_2c0 [32];
  string local_2a0 [32];
  _Self local_280;
  _Base_ptr local_278;
  int local_270;
  char local_269;
  undefined1 local_268 [39];
  allocator<char> local_241;
  string local_240 [32];
  _Self local_220;
  _Self local_218;
  undefined1 local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [32];
  _Self local_1c8;
  allocator<char> local_1b9;
  string local_1b8 [32];
  _Self local_198;
  allocator<char> local_189;
  string local_188 [32];
  char *local_168;
  char *local_160;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  byte local_d9;
  int local_b4;
  undefined1 *local_b0;
  reference local_98;
  _Self local_90;
  _Self local_88;
  long local_80;
  undefined1 local_48 [48];
  key_type *local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  ::map((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
         *)0x10fd2b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
         *)0x10fd38);
  local_80 = in_RDI + 0x18;
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ::begin((list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ::end((list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  while (bVar3 = std::operator!=(&local_88,&local_90), bVar3) {
    local_98 = std::
               _List_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
               ::operator*((_List_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
                            *)0x10fda1);
    pBVar8 = std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::operator->
                       ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                        0x10fdb6);
    if (pBVar8->s != '\0') {
      pBVar8 = std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::get
                         ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                          in_stack_fffffffffffffb20);
      std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::operator->
                ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)0x10fdde)
      ;
      ppBVar9 = std::
                map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                ::operator[]((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                              *)in_stack_fffffffffffffb60,
                             (key_type_conflict *)in_stack_fffffffffffffb58);
      *ppBVar9 = pBVar8;
    }
    pBVar8 = std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::get
                       ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                        in_stack_fffffffffffffb20);
    std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::operator->
              ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)0x10fe4c);
    ppBVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                             *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    *ppBVar10 = pBVar8;
    std::
    _List_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>::
    operator++(&local_88);
  }
  local_b0 = local_48;
  local_b4 = 1;
  do {
    if ((int)local_c <= local_b4) {
      bVar4 = *(byte *)(in_RDI + 0x30) ^ 0xff;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
              *)0x110eb2);
      std::
      map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
      ::~map((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
              *)0x110ebf);
      return (bool)(bVar4 & 1);
    }
    if (**(char **)(&local_18->_M_dataplus + (long)local_b4 * 8) != '\0') {
      local_d9 = 0;
      local_331 = true;
      if (**(char **)(&local_18->_M_dataplus + (long)local_b4 * 8) == '-') {
        std::function<bool(char)>::function<opts::Options::parse(int,char**)::__0&,void>
                  ((function<bool_(char)> *)in_stack_fffffffffffffb30,
                   (anon_class_8_1_facd13c1 *)
                   CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        local_d9 = 1;
        local_331 = dashed_non_option((char *)in_stack_fffffffffffffb30,
                                      (IsShort *)
                                      CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
        ;
      }
      if ((local_d9 & 1) != 0) {
        std::function<bool_(char)>::~function((function<bool_(char)> *)0x10ffa2);
      }
      if (local_331 == false) {
        if (*(char *)(*(long *)(&local_18->_M_dataplus + (long)local_b4 * 8) + 1) == '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb30,
                      (value_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator(&local_129);
        }
        else if (*(char *)(*(long *)(&local_18->_M_dataplus + (long)local_b4 * 8) + 1) == '-') {
          if (*(char *)(*(long *)(&local_18->_M_dataplus + (long)local_b4 * 8) + 2) == '\0') {
            while (local_b4 = local_b4 + 1, local_b4 < (int)local_c) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffb30,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              std::__cxx11::string::~string(local_150);
              std::allocator<char>::~allocator(&local_151);
            }
          }
          else {
            local_160 = (char *)(*(long *)(&local_18->_M_dataplus + (long)local_b4 * 8) + 2);
            local_168 = local_160;
            while( true ) {
              bVar3 = false;
              if (*local_168 != '=') {
                bVar3 = *local_168 != '\0';
              }
              if (!bVar3) break;
              local_168 = local_168 + 1;
            }
            if (local_160 == local_168) {
              *(undefined1 *)(in_RDI + 0x30) = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
              unrecognized_option((Options *)in_stack_fffffffffffffb20,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
              std::__cxx11::string::~string(local_188);
              std::allocator<char>::~allocator(&local_189);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<char*,void>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                         in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              local_198._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                           *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                          (key_type *)0x1104f1);
              std::__cxx11::string::~string(local_1b8);
              std::allocator<char>::~allocator(&local_1b9);
              local_1c8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                          *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
              bVar3 = std::operator==(&local_198,&local_1c8);
              if (bVar3) {
                *(undefined1 *)(in_RDI + 0x30) = 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
                unrecognized_option((Options *)in_stack_fffffffffffffb20,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
                std::__cxx11::string::~string(local_1e8);
                std::allocator<char>::~allocator(&local_1e9);
              }
              else {
                ppVar11 = std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>
                                        *)0x110689);
                uVar7 = local_c;
                pkVar2 = local_18;
                pBVar1 = ppVar11->second;
                uVar5 = (int)local_168 - *(int *)(&local_18->_M_dataplus + (long)local_b4 * 8);
                std::function<bool(char)>::function<opts::Options::parse(int,char**)::__0&,void>
                          ((function<bool_(char)> *)in_stack_fffffffffffffb30,
                           (anon_class_8_1_facd13c1 *)
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                iVar6 = (*pBVar1->_vptr_BasicOption[3])
                                  (pBVar1,(ulong)uVar7,pkVar2,&local_b4,(ulong)uVar5,local_210);
                *(bool *)(in_RDI + 0x30) =
                     (*(byte *)(in_RDI + 0x30) & 1) != 0 || (((byte)iVar6 ^ 0xff) & 1) != 0;
                std::function<bool_(char)>::~function((function<bool_(char)> *)0x110768);
              }
            }
          }
        }
        else {
          local_218._M_node =
               (_Base_ptr)
               std::
               map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
               ::find((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                       *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                      (key_type_conflict *)0x1107bd);
          local_220._M_node =
               (_Base_ptr)
               std::
               map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
               ::end((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                      *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
          bVar3 = std::operator==(&local_218,&local_220);
          if (bVar3) {
            *(undefined1 *)(in_RDI + 0x30) = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
            unrecognized_option((Options *)in_stack_fffffffffffffb20,
                                (string *)
                                CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
            std::__cxx11::string::~string(local_240);
            std::allocator<char>::~allocator(&local_241);
          }
          else {
            ppVar12 = std::_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_>::
                      operator->((_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_> *)
                                 0x1108f2);
            uVar7 = (*ppVar12->second->_vptr_BasicOption[2])();
            if ((uVar7 & 1) == 0) {
              ppVar12 = std::_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_>::
                        operator->((_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_> *
                                   )0x110dab);
              in_stack_fffffffffffffb20 = ppVar12->second;
              in_stack_fffffffffffffb38 = local_308;
              in_stack_fffffffffffffb2c = local_c;
              in_stack_fffffffffffffb30 = local_18;
              std::function<bool(char)>::function<opts::Options::parse(int,char**)::__0&,void>
                        ((function<bool_(char)> *)local_18,
                         (anon_class_8_1_facd13c1 *)CONCAT44(local_c,in_stack_fffffffffffffb28));
              iVar6 = (*in_stack_fffffffffffffb20->_vptr_BasicOption[3])
                                (in_stack_fffffffffffffb20,(ulong)in_stack_fffffffffffffb2c,
                                 in_stack_fffffffffffffb30,&local_b4,2,in_stack_fffffffffffffb38);
              in_stack_fffffffffffffb47 = (byte)iVar6;
              *(bool *)(in_RDI + 0x30) =
                   (*(byte *)(in_RDI + 0x30) & 1) != 0 ||
                   ((in_stack_fffffffffffffb47 ^ 0xff) & 1) != 0;
              std::function<bool_(char)>::~function((function<bool_(char)> *)0x110e4f);
            }
            else {
              ppVar12 = std::_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_>::
                        operator->((_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_> *
                                   )0x110925);
              uVar7 = local_c;
              pkVar2 = local_18;
              pBVar1 = ppVar12->second;
              std::function<bool(char)>::function<opts::Options::parse(int,char**)::__0&,void>
                        ((function<bool_(char)> *)in_stack_fffffffffffffb30,
                         (anon_class_8_1_facd13c1 *)
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              (*pBVar1->_vptr_BasicOption[3])(pBVar1,(ulong)uVar7,pkVar2,&local_b4,0,local_268);
              std::function<bool_(char)>::~function((function<bool_(char)> *)0x1109ae);
              for (local_270 = 1;
                  local_269 = *(char *)(*(long *)(&local_18->_M_dataplus + (long)local_b4 * 8) +
                                       (long)local_270), local_269 != '\0';
                  local_270 = local_270 + 1) {
                iVar6 = isprint((int)local_269);
                if ((iVar6 == 0) || (local_269 == '-')) {
                  *(undefined1 *)(in_RDI + 0x30) = 1;
                  poVar13 = std::operator<<((ostream *)&std::cerr,"error: invalid character\'");
                  poVar13 = std::operator<<(poVar13,local_269);
                  poVar13 = std::operator<<(poVar13," ignoring ");
                  poVar13 = std::operator<<(poVar13,(char *)(*(long *)(&local_18->_M_dataplus +
                                                                      (long)local_b4 * 8) +
                                                            (long)local_270));
                  std::operator<<(poVar13,'\n');
                  break;
                }
                local_278 = (_Base_ptr)
                            std::
                            map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                            ::find((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                                   (key_type_conflict *)0x110af8);
                local_218._M_node = local_278;
                local_280._M_node =
                     (_Base_ptr)
                     std::
                     map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                     ::end((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                            *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
                bVar3 = std::operator==(&local_218,&local_280);
                if (bVar3) {
                  *(undefined1 *)(in_RDI + 0x30) = 1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                             (size_type)in_stack_fffffffffffffb38,
                             (char)((ulong)in_stack_fffffffffffffb30 >> 0x38),
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                  std::operator+((char *)CONCAT44(in_stack_fffffffffffffb2c,
                                                  in_stack_fffffffffffffb28),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb20);
                  unrecognized_option((Options *)in_stack_fffffffffffffb20,
                                      (string *)
                                      CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18))
                  ;
                  std::__cxx11::string::~string(local_2a0);
                  std::__cxx11::string::~string(local_2c0);
                  std::allocator<char>::~allocator(&local_2c1);
                }
                else {
                  ppVar12 = std::_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_>::
                            operator->((_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_>
                                        *)0x110c70);
                  uVar7 = (*ppVar12->second->_vptr_BasicOption[2])();
                  if ((uVar7 & 1) == 0) {
                    *(undefined1 *)(in_RDI + 0x30) = 1;
                    poVar13 = std::operator<<((ostream *)&std::cerr,
                                              "error: non-void options not allowed in option packs; ignoring "
                                             );
                    poVar13 = std::operator<<(poVar13,local_269);
                    std::operator<<(poVar13,'\n');
                  }
                  else {
                    ppVar12 = std::_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_>::
                              operator->((_Rb_tree_iterator<std::pair<const_char,_opts::BasicOption_*>_>
                                          *)0x110cec);
                    pBVar1 = ppVar12->second;
                    in_stack_fffffffffffffb60 = &local_2e8;
                    in_stack_fffffffffffffb54 = local_c;
                    in_stack_fffffffffffffb58 = local_18;
                    std::function<bool(char)>::function<opts::Options::parse(int,char**)::__0&,void>
                              ((function<bool_(char)> *)in_stack_fffffffffffffb30,
                               (anon_class_8_1_facd13c1 *)
                               CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                    (*pBVar1->_vptr_BasicOption[3])
                              (pBVar1,(ulong)in_stack_fffffffffffffb54,in_stack_fffffffffffffb58,
                               &local_b4,0,in_stack_fffffffffffffb60);
                    std::function<bool_(char)>::~function((function<bool_(char)> *)0x110d5d);
                  }
                }
              }
            }
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50))
        ;
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb30,
                    (value_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator(&local_101);
      }
    }
    local_b4 = local_b4 + 1;
  } while( true );
}

Assistant:

bool
Options::parse(int argc, char** argv)
{
    std::map<char, BasicOption*>                    short_opts;
    std::map<std::string, BasicOption*>             long_opts;

    for (auto& opt : options)
    {
        if (opt->s)
            short_opts[opt->s] = opt.get();

        long_opts[opt->l] = opt.get();
    }

    auto is_short = [&short_opts](char c) -> bool   { return short_opts.find(c) != short_opts.end(); };

    for (int i = 1; i < argc; ++i)
    {
        if( argv[ i ][ 0 ] == '\0' )
            continue;
        if( argv[ i ][ 0 ] != '-' || dashed_non_option(argv[i], is_short))
            args.push_back(argv[i]);
        else
        {
            // -...
            if( argv[ i ][ 1 ] == '\0' )
            {
                // -
                args.push_back(argv[i]);
            } else if( argv[ i ][ 1 ] == '-' )
            {
                if( argv[ i ][ 2 ] == '\0' )
                {
                    // --
                    while( ++i < argc )
                        args.push_back(argv[i]);
                } else {
                    // --...
                    char* first = &argv[ i ][ 2 ];
                    char* last = first;
                    for(; *last != '=' && *last != '\0'; ++last);
                    if (first == last)
                    {
                        failed = true;
                        unrecognized_option(argv[i]);
                    } else
                    {
                        auto opt_it = long_opts.find(std::string{first,last});
                        if (opt_it == long_opts.end())
                        {
                            failed = true;
                            unrecognized_option(argv[i]);
                        } else
                        {
                            failed |= !opt_it->second->parse(argc, argv, i, static_cast<int>(last - argv[i]), is_short);
                        }
                    }
                }
            } else
            {
                // -f...
                auto opt_it = short_opts.find(argv[i][1]);
                if (opt_it == short_opts.end())
                {
                    failed = true;
                    unrecognized_option(argv[i]);
                } else if (opt_it->second->flag())
                {
                    opt_it->second->parse(argc, argv, i, 0, is_short);      // arguments are meaningless; just sets the flag

                    // -fgh
                    char c;
                    for(int j = 1; (c = argv[i][j]) != '\0'; ++j)
                    {
                        if (!std::isprint(c) || c == '-')
                        {
                            failed = true;
                            std::cerr << "error: invalid character\'" << c << " ignoring " << &argv[i][j] << '\n';
                            break;
                        }
                        opt_it = short_opts.find(c);
                        if (opt_it == short_opts.end())
                        {
                            failed = true;
                            unrecognized_option("-" + std::string(1, c));
                            continue;
                        }
                        if (!opt_it->second->flag())
                        {
                            failed = true;
                            std::cerr << "error: non-void options not allowed in option packs; ignoring " << c << '\n';
                            continue;
                        }
                        opt_it->second->parse(argc, argv, i, 0, is_short);     // arguments are meaningless; just sets the flag
                    }
                } else
                {
                    failed |= !opt_it->second->parse(argc, argv, i, 2, is_short);
                }
            }
        }
    }

    return !failed;
}